

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::
optimizeSetIfWithCopyArm(wasm::Expression___(void *this,Expression **currp)

{
  bool bVar1;
  LocalSet *this_00;
  Module *wasm;
  Module *local_50;
  Expression *replacement;
  LocalGet *pLStack_40;
  bool tee;
  LocalGet *get;
  Builder builder;
  If *iff;
  LocalSet *set;
  Expression **currp_local;
  FinalOptimizer *this_local;
  
  this_00 = Expression::cast<wasm::LocalSet>(*currp);
  builder.wasm = (Module *)Expression::dynCast<wasm::If>(this_00->value);
  if (((builder.wasm == (Module *)0x0) ||
      (bVar1 = wasm::Type::isConcrete
                         ((Type *)&((builder.wasm)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish), !bVar1)) ||
     (bVar1 = wasm::Type::isConcrete
                        ((Type *)(((builder.wasm)->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)), !bVar1))
  {
    this_local._7_1_ = false;
  }
  else {
    wasm = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                     ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
    Builder::Builder((Builder *)&get,wasm);
    pLStack_40 = Expression::dynCast<wasm::LocalGet>
                           ((Expression *)
                            ((builder.wasm)->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    if ((pLStack_40 == (LocalGet *)0x0) || (pLStack_40->index != this_00->index)) {
      pLStack_40 = Expression::dynCast<wasm::LocalGet>
                             ((Expression *)
                              ((builder.wasm)->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
      if ((pLStack_40 != (LocalGet *)0x0) && (pLStack_40->index != this_00->index)) {
        pLStack_40 = (LocalGet *)0x0;
      }
    }
    else {
      Builder::flip((Builder *)&get,(If *)builder.wasm);
    }
    if (pLStack_40 == (LocalGet *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = LocalSet::isTee(this_00);
      if (this_00->index != pLStack_40->index) {
        __assert_fail("set->index == get->index",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                      ,0x521,
                      "bool wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::optimizeSetIfWithCopyArm(Expression **)"
                     );
      }
      if ((LocalGet *)
          ((builder.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pLStack_40) {
        __assert_fail("iff->ifFalse == get",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                      ,0x522,
                      "bool wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::optimizeSetIfWithCopyArm(Expression **)"
                     );
      }
      this_00->value =
           (Expression *)
           ((builder.wasm)->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      LocalSet::finalize(this_00);
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      If::finalize((If *)builder.wasm);
      local_50 = builder.wasm;
      if (bVar1) {
        LocalSet::makeSet(this_00);
        local_50 = (Module *)
                   Builder::makeSequence((Builder *)&get,builder.wasm,(Expression *)pLStack_40);
      }
      *currp = (Expression *)local_50;
      optimizeSetIf(wasm::Expression___(this,(Expression **)&(builder.wasm)->functions);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool optimizeSetIfWithCopyArm(Expression** currp) {
        auto* set = (*currp)->cast<LocalSet>();
        auto* iff = set->value->dynCast<If>();
        if (!iff || !iff->type.isConcrete() ||
            !iff->condition->type.isConcrete()) {
          return false;
        }
        Builder builder(*getModule());
        LocalGet* get = iff->ifTrue->dynCast<LocalGet>();
        if (get && get->index == set->index) {
          builder.flip(iff);
        } else {
          get = iff->ifFalse->dynCast<LocalGet>();
          if (get && get->index != set->index) {
            get = nullptr;
          }
        }
        if (!get) {
          return false;
        }
        // We can do it!
        bool tee = set->isTee();
        assert(set->index == get->index);
        assert(iff->ifFalse == get);
        set->value = iff->ifTrue;
        set->finalize();
        iff->ifTrue = set;
        iff->ifFalse = nullptr;
        iff->finalize();
        Expression* replacement = iff;
        if (tee) {
          set->makeSet();
          // We need a block too.
          replacement = builder.makeSequence(iff,
                                             get // reuse the get
          );
        }
        *currp = replacement;
        // Recurse on the set, which now has a new value.
        optimizeSetIf(&iff->ifTrue);
        return true;
      }